

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O3

string * __thiscall
flatbuffers::dart::DartGenerator::GenObjectBuilderImplementation_abi_cxx11_
          (string *__return_storage_ptr__,DartGenerator *this,StructDef *struct_def,
          vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
          *non_deprecated_fields,bool prependUnderscore,bool pack)

{
  IdlNamer *pIVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  BaseType BVar3;
  FieldDef *pFVar4;
  long *plVar5;
  undefined8 *puVar6;
  pointer ppVar7;
  size_type *psVar8;
  long *plVar9;
  undefined8 uVar10;
  _Alloc_hider _Var11;
  undefined7 in_register_00000089;
  pointer ppVar12;
  string field_name;
  string offset_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string *local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  undefined4 local_ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  DartGenerator *local_88;
  ulong local_80;
  vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
  *local_78;
  char *local_70;
  Type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  StructDef *local_40;
  char *local_38;
  
  local_ec = (undefined4)CONCAT71(in_register_00000089,pack);
  local_48 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_48;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ppVar12 = (non_deprecated_fields->
            super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppVar7 = (non_deprecated_fields->
           super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_80 = (ulong)prependUnderscore;
  local_138 = __return_storage_ptr__;
  local_88 = this;
  local_78 = non_deprecated_fields;
  local_40 = struct_def;
  if (ppVar12 != ppVar7) {
    pIVar1 = &this->namer_;
    local_38 = "";
    if (prependUnderscore) {
      local_38 = "_";
    }
    paVar2 = &local_130.field_2;
    local_70 = "getOrCreateOffset";
    if (pack) {
      local_70 = "pack";
    }
    do {
      pFVar4 = ppVar12->second;
      BVar3 = (pFVar4->value).type.base_type;
      if ((0xb < BVar3 - BASE_TYPE_UTYPE) &&
         ((BVar3 != BASE_TYPE_STRUCT || (((pFVar4->value).type.struct_def)->fixed == false)))) {
        (*(pIVar1->super_Namer)._vptr_Namer[7])(&local_c8,pIVar1,pFVar4);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_c8);
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        psVar8 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_a8.field_2._M_allocated_capacity = *psVar8;
          local_a8.field_2._8_8_ = plVar5[3];
        }
        else {
          local_a8.field_2._M_allocated_capacity = *psVar8;
          local_a8._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_a8._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        (*(pIVar1->super_Namer)._vptr_Namer[7])(&local_158,pIVar1,pFVar4);
        plVar5 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_158,0,(char *)0x0,(ulong)local_38);
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        psVar8 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_c8.field_2._M_allocated_capacity = *psVar8;
          local_c8.field_2._8_8_ = plVar5[3];
        }
        else {
          local_c8.field_2._M_allocated_capacity = *psVar8;
          local_c8._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_c8._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if ((((char)local_ec == '\0') ||
            (((BVar3 = (pFVar4->value).type.base_type, BVar3 != BASE_TYPE_VECTOR64 &&
              (BVar3 != BASE_TYPE_VECTOR)) || ((pFVar4->value).type.element != BASE_TYPE_STRUCT))))
           || (((pFVar4->value).type.struct_def)->fixed != true)) {
          std::operator+(&local_158,"    final int? ",&local_a8);
          std::__cxx11::string::_M_append((char *)local_138,(ulong)local_158._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          BVar3 = (pFVar4->value).type.base_type;
          if (BVar3 == BASE_TYPE_STRING) {
            std::operator+(&local_130," = ",&local_c8);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
            psVar8 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar8) {
              local_158.field_2._M_allocated_capacity = *psVar8;
              local_158.field_2._8_8_ = plVar5[3];
            }
            else {
              local_158.field_2._M_allocated_capacity = *psVar8;
              local_158._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_158._M_string_length = plVar5[1];
            *plVar5 = (long)psVar8;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_138,(ulong)local_158._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != paVar2) {
              operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1
                             );
            }
            std::operator+(&local_130,"        : fbBuilder.writeString(",&local_c8);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
            psVar8 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar8) {
              local_158.field_2._M_allocated_capacity = *psVar8;
              local_158.field_2._8_8_ = plVar5[3];
            }
            else {
              local_158.field_2._M_allocated_capacity = *psVar8;
              local_158._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_158._M_string_length = plVar5[1];
            *plVar5 = (long)psVar8;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_138,(ulong)local_158._M_dataplus._M_p);
LAB_001d3a9c:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1
                             );
            }
            uVar10 = local_130.field_2._M_allocated_capacity;
            _Var11._M_p = local_130._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p == paVar2) goto LAB_001d3c17;
          }
          else {
            if ((BVar3 == BASE_TYPE_VECTOR64) || (BVar3 == BASE_TYPE_VECTOR)) {
              std::operator+(&local_130," = ",&local_c8);
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
              local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
              psVar8 = (size_type *)(plVar5 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar5 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar8) {
                local_158.field_2._M_allocated_capacity = *psVar8;
                local_158.field_2._8_8_ = plVar5[3];
              }
              else {
                local_158.field_2._M_allocated_capacity = *psVar8;
                local_158._M_dataplus._M_p = (pointer)*plVar5;
              }
              local_158._M_string_length = plVar5[1];
              *plVar5 = (long)psVar8;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_138,(ulong)local_158._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158._M_dataplus._M_p != &local_158.field_2) {
                operator_delete(local_158._M_dataplus._M_p,
                                local_158.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130._M_dataplus._M_p != paVar2) {
                operator_delete(local_130._M_dataplus._M_p,
                                local_130.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::string::append((char *)local_138);
              BVar3 = (pFVar4->value).type.element;
              if (BVar3 == BASE_TYPE_STRING) {
                std::operator+(&local_130,"(",&local_c8);
                plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
                local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                psVar8 = (size_type *)(plVar5 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar5 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar8) {
                  local_158.field_2._M_allocated_capacity = *psVar8;
                  local_158.field_2._8_8_ = plVar5[3];
                }
                else {
                  local_158.field_2._M_allocated_capacity = *psVar8;
                  local_158._M_dataplus._M_p = (pointer)*plVar5;
                }
                local_158._M_string_length = plVar5[1];
                *plVar5 = (long)psVar8;
                plVar5[1] = 0;
                *(undefined1 *)(plVar5 + 2) = 0;
                std::__cxx11::string::_M_append((char *)local_138,(ulong)local_158._M_dataplus._M_p)
                ;
              }
              else {
                if (BVar3 != BASE_TYPE_STRUCT) {
                  local_68.fixed_length = (pFVar4->value).type.fixed_length;
                  local_68.element = BASE_TYPE_NONE;
                  local_68.struct_def = (pFVar4->value).type.struct_def;
                  local_68.enum_def = (pFVar4->value).type.enum_def;
                  local_68.base_type = BVar3;
                  GenType_abi_cxx11_(&local_e8,local_88,&local_68);
                  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_e8);
                  local_110 = &local_100;
                  plVar5 = puVar6 + 2;
                  if ((long *)*puVar6 == plVar5) {
                    local_100 = *plVar5;
                    lStack_f8 = puVar6[3];
                  }
                  else {
                    local_100 = *plVar5;
                    local_110 = (long *)*puVar6;
                  }
                  local_108 = puVar6[1];
                  *puVar6 = plVar5;
                  puVar6[1] = 0;
                  *(undefined1 *)(puVar6 + 2) = 0;
                  puVar6 = (undefined8 *)
                           std::__cxx11::string::_M_append
                                     ((char *)&local_110,(ulong)local_c8._M_dataplus._M_p);
                  psVar8 = puVar6 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar6 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar8) {
                    local_130.field_2._M_allocated_capacity = *psVar8;
                    local_130.field_2._8_8_ = puVar6[3];
                    local_130._M_dataplus._M_p = (pointer)paVar2;
                  }
                  else {
                    local_130.field_2._M_allocated_capacity = *psVar8;
                    local_130._M_dataplus._M_p = (pointer)*puVar6;
                  }
                  local_130._M_string_length = puVar6[1];
                  *puVar6 = psVar8;
                  puVar6[1] = 0;
                  *(undefined1 *)(puVar6 + 2) = 0;
                  plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
                  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                  psVar8 = (size_type *)(plVar5 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar5 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar8) {
                    local_158.field_2._M_allocated_capacity = *psVar8;
                    local_158.field_2._8_8_ = plVar5[3];
                  }
                  else {
                    local_158.field_2._M_allocated_capacity = *psVar8;
                    local_158._M_dataplus._M_p = (pointer)*plVar5;
                  }
                  local_158._M_string_length = plVar5[1];
                  *plVar5 = (long)psVar8;
                  plVar5[1] = 0;
                  *(undefined1 *)(plVar5 + 2) = 0;
                  std::__cxx11::string::_M_append
                            ((char *)local_138,(ulong)local_158._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_158._M_dataplus._M_p != &local_158.field_2) {
                    operator_delete(local_158._M_dataplus._M_p,
                                    local_158.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_130._M_dataplus._M_p != paVar2) {
                    operator_delete(local_130._M_dataplus._M_p,
                                    local_130.field_2._M_allocated_capacity + 1);
                  }
                  if (local_110 != &local_100) {
                    operator_delete(local_110,local_100 + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                    operator_delete(local_e8._M_dataplus._M_p,
                                    local_e8.field_2._M_allocated_capacity + 1);
                  }
                  if ((pFVar4->value).type.enum_def != (EnumDef *)0x0) {
                    std::__cxx11::string::append((char *)local_138);
                  }
                  goto LAB_001d3a5c;
                }
                if (((pFVar4->value).type.struct_def)->fixed != true) {
                  std::operator+(&local_e8,"(",&local_c8);
                  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_e8);
                  local_110 = &local_100;
                  plVar5 = puVar6 + 2;
                  if ((long *)*puVar6 == plVar5) {
                    local_100 = *plVar5;
                    lStack_f8 = puVar6[3];
                  }
                  else {
                    local_100 = *plVar5;
                    local_110 = (long *)*puVar6;
                  }
                  local_108 = puVar6[1];
                  *puVar6 = plVar5;
                  puVar6[1] = 0;
                  *(undefined1 *)(puVar6 + 2) = 0;
                  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
                  psVar8 = puVar6 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar6 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar8) {
                    local_130.field_2._M_allocated_capacity = *psVar8;
                    local_130.field_2._8_8_ = puVar6[3];
                    local_130._M_dataplus._M_p = (pointer)paVar2;
                  }
                  else {
                    local_130.field_2._M_allocated_capacity = *psVar8;
                    local_130._M_dataplus._M_p = (pointer)*puVar6;
                  }
                  local_130._M_string_length = puVar6[1];
                  *puVar6 = psVar8;
                  puVar6[1] = 0;
                  *(undefined1 *)(puVar6 + 2) = 0;
                  plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
                  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                  psVar8 = (size_type *)(plVar5 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar5 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar8) {
                    local_158.field_2._M_allocated_capacity = *psVar8;
                    local_158.field_2._8_8_ = plVar5[3];
                  }
                  else {
                    local_158.field_2._M_allocated_capacity = *psVar8;
                    local_158._M_dataplus._M_p = (pointer)*plVar5;
                  }
                  local_158._M_string_length = plVar5[1];
                  *plVar5 = (long)psVar8;
                  plVar5[1] = 0;
                  *(undefined1 *)(plVar5 + 2) = 0;
                  std::__cxx11::string::_M_append
                            ((char *)local_138,(ulong)local_158._M_dataplus._M_p);
                  goto LAB_001d3ba7;
                }
                std::operator+(&local_130,"OfStructs(",&local_c8);
                plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
                local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                psVar8 = (size_type *)(plVar5 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar5 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar8) {
                  local_158.field_2._M_allocated_capacity = *psVar8;
                  local_158.field_2._8_8_ = plVar5[3];
                }
                else {
                  local_158.field_2._M_allocated_capacity = *psVar8;
                  local_158._M_dataplus._M_p = (pointer)*plVar5;
                }
                local_158._M_string_length = plVar5[1];
                *plVar5 = (long)psVar8;
                plVar5[1] = 0;
                *(undefined1 *)(plVar5 + 2) = 0;
                std::__cxx11::string::_M_append((char *)local_138,(ulong)local_158._M_dataplus._M_p)
                ;
              }
              goto LAB_001d3a9c;
            }
            std::operator+(&local_e8," = ",&local_c8);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_e8);
            local_110 = &local_100;
            plVar9 = plVar5 + 2;
            if ((long *)*plVar5 == plVar9) {
              local_100 = *plVar9;
              lStack_f8 = plVar5[3];
            }
            else {
              local_100 = *plVar9;
              local_110 = (long *)*plVar5;
            }
            local_108 = plVar5[1];
            *plVar5 = (long)plVar9;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
            psVar8 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar8) {
              local_130.field_2._M_allocated_capacity = *psVar8;
              local_130.field_2._8_8_ = plVar5[3];
              local_130._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_130.field_2._M_allocated_capacity = *psVar8;
              local_130._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_130._M_string_length = plVar5[1];
            *plVar5 = (long)psVar8;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
            psVar8 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar8) {
              local_158.field_2._M_allocated_capacity = *psVar8;
              local_158.field_2._8_8_ = plVar5[3];
            }
            else {
              local_158.field_2._M_allocated_capacity = *psVar8;
              local_158._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_158._M_string_length = plVar5[1];
            *plVar5 = (long)psVar8;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_138,(ulong)local_158._M_dataplus._M_p);
LAB_001d3ba7:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != paVar2) {
              operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_110 != &local_100) {
              operator_delete(local_110,local_100 + 1);
            }
            uVar10 = local_e8.field_2._M_allocated_capacity;
            _Var11._M_p = local_e8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p == &local_e8.field_2) goto LAB_001d3c17;
          }
          operator_delete(_Var11._M_p,uVar10 + 1);
        }
        else {
          std::operator+(&local_130,"    int? ",&local_a8);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          psVar8 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_158.field_2._M_allocated_capacity = *psVar8;
            local_158.field_2._8_8_ = plVar5[3];
          }
          else {
            local_158.field_2._M_allocated_capacity = *psVar8;
            local_158._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_158._M_string_length = plVar5[1];
          *plVar5 = (long)psVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_138,(ulong)local_158._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != paVar2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_130,"    if (",&local_c8);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          psVar8 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_158.field_2._M_allocated_capacity = *psVar8;
            local_158.field_2._8_8_ = plVar5[3];
          }
          else {
            local_158.field_2._M_allocated_capacity = *psVar8;
            local_158._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_158._M_string_length = plVar5[1];
          *plVar5 = (long)psVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_138,(ulong)local_158._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != paVar2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_130,"      for (var e in ",&local_c8);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          psVar8 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_158.field_2._M_allocated_capacity = *psVar8;
            local_158.field_2._8_8_ = plVar5[3];
          }
          else {
            local_158.field_2._M_allocated_capacity = *psVar8;
            local_158._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_158._M_string_length = plVar5[1];
          *plVar5 = (long)psVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_138,(ulong)local_158._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != paVar2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          (*(pIVar1->super_Namer)._vptr_Namer[7])(&local_68,pIVar1,pFVar4);
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x360847);
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          psVar8 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_e8.field_2._M_allocated_capacity = *psVar8;
            local_e8.field_2._8_8_ = puVar6[3];
          }
          else {
            local_e8.field_2._M_allocated_capacity = *psVar8;
            local_e8._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_e8._M_string_length = puVar6[1];
          *puVar6 = psVar8;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_e8);
          local_110 = &local_100;
          plVar5 = puVar6 + 2;
          if ((long *)*puVar6 == plVar5) {
            local_100 = *plVar5;
            lStack_f8 = puVar6[3];
          }
          else {
            local_100 = *plVar5;
            local_110 = (long *)*puVar6;
          }
          local_108 = puVar6[1];
          *puVar6 = plVar5;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_110,(ulong)local_c8._M_dataplus._M_p);
          psVar8 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_130.field_2._M_allocated_capacity = *psVar8;
            local_130.field_2._8_8_ = puVar6[3];
            local_130._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_130.field_2._M_allocated_capacity = *psVar8;
            local_130._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_130._M_string_length = puVar6[1];
          *puVar6 = psVar8;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          psVar8 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_158.field_2._M_allocated_capacity = *psVar8;
            local_158.field_2._8_8_ = plVar5[3];
          }
          else {
            local_158.field_2._M_allocated_capacity = *psVar8;
            local_158._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_158._M_string_length = plVar5[1];
          *plVar5 = (long)psVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_138,(ulong)local_158._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != paVar2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          if (local_110 != &local_100) {
            operator_delete(local_110,local_100 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          if ((EnumDef **)CONCAT44(local_68.element,local_68.base_type) != &local_68.enum_def) {
            operator_delete((undefined1 *)CONCAT44(local_68.element,local_68.base_type),
                            (ulong)((long)&((local_68.enum_def)->super_Definition).name._M_dataplus.
                                           _M_p + 1));
          }
LAB_001d3a5c:
          std::__cxx11::string::append((char *)local_138);
        }
LAB_001d3c17:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        ppVar7 = (local_78->
                 super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      }
      ppVar12 = ppVar12 + 1;
    } while (ppVar12 != ppVar7);
  }
  if (local_40->fixed == false) {
    TableObjectBuilderBody_abi_cxx11_
              (&local_a8,local_88,local_40,local_78,SUB81(local_80,0),(bool)(char)local_ec);
    std::__cxx11::string::_M_append((char *)local_138,(ulong)local_a8._M_dataplus._M_p);
  }
  else {
    StructObjectBuilderBody_abi_cxx11_
              (&local_a8,local_88,local_78,SUB81(local_80,0),(bool)(char)local_ec);
    std::__cxx11::string::_M_append((char *)local_138,(ulong)local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  return local_138;
}

Assistant:

std::string GenObjectBuilderImplementation(
      const StructDef &struct_def,
      const std::vector<std::pair<int, FieldDef *>> &non_deprecated_fields,
      bool prependUnderscore = true, bool pack = false) {
    std::string code;
    for (auto it = non_deprecated_fields.begin();
         it != non_deprecated_fields.end(); ++it) {
      const FieldDef &field = *it->second;

      if (IsScalar(field.value.type.base_type) || IsStruct(field.value.type))
        continue;

      std::string offset_name = namer_.Variable(field) + "Offset";
      std::string field_name =
          (prependUnderscore ? "_" : "") + namer_.Variable(field);
      // custom handling for fixed-sized struct in pack()
      if (pack && IsVector(field.value.type) &&
          field.value.type.VectorType().base_type == BASE_TYPE_STRUCT &&
          field.value.type.struct_def->fixed) {
        code += "    int? " + offset_name + ";\n";
        code += "    if (" + field_name + " != null) {\n";
        code +=
            "      for (var e in " + field_name + "!) { e.pack(fbBuilder); }\n";
        code += "      " + namer_.Variable(field) +
                "Offset = fbBuilder.endStructVector(" + field_name +
                "!.length);\n";
        code += "    }\n";
        continue;
      }

      code += "    final int? " + offset_name;
      if (IsVector(field.value.type)) {
        code += " = " + field_name + " == null ? null\n";
        code += "        : fbBuilder.writeList";
        switch (field.value.type.VectorType().base_type) {
          case BASE_TYPE_STRING:
            code +=
                "(" + field_name + "!.map(fbBuilder.writeString).toList());\n";
            break;
          case BASE_TYPE_STRUCT:
            if (field.value.type.struct_def->fixed) {
              code += "OfStructs(" + field_name + "!);\n";
            } else {
              code += "(" + field_name + "!.map((b) => b." +
                      (pack ? "pack" : "getOrCreateOffset") +
                      "(fbBuilder)).toList());\n";
            }
            break;
          default:
            code +=
                GenType(field.value.type.VectorType()) + "(" + field_name + "!";
            if (field.value.type.enum_def) {
              code += ".map((f) => f.value).toList()";
            }
            code += ");\n";
        }
      } else if (IsString(field.value.type)) {
        code += " = " + field_name + " == null ? null\n";
        code += "        : fbBuilder.writeString(" + field_name + "!);\n";
      } else {
        code += " = " + field_name + "?." +
                (pack ? "pack" : "getOrCreateOffset") + "(fbBuilder);\n";
      }
    }

    if (struct_def.fixed) {
      code += StructObjectBuilderBody(non_deprecated_fields, prependUnderscore,
                                      pack);
    } else {
      code += TableObjectBuilderBody(struct_def, non_deprecated_fields,
                                     prependUnderscore, pack);
    }
    return code;
  }